

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_rc2_test.c
# Opt level: O0

MPP_RET mpi_rc_info_change(MpiRc2TestCtx *ctx,MppFrame frm)

{
  MppEncCfg pvVar1;
  undefined4 uVar2;
  MPP_RET MVar3;
  MPP_RET ret;
  MppFrame frm_local;
  MpiRc2TestCtx *ctx_local;
  
  pvVar1 = ctx->cfg;
  uVar2 = mpp_frame_get_width(frm);
  mpp_enc_cfg_set_s32(pvVar1,"prep:width",uVar2);
  pvVar1 = ctx->cfg;
  uVar2 = mpp_frame_get_height(frm);
  mpp_enc_cfg_set_s32(pvVar1,"prep:height",uVar2);
  pvVar1 = ctx->cfg;
  uVar2 = mpp_frame_get_hor_stride(frm);
  mpp_enc_cfg_set_s32(pvVar1,"prep:hor_stride",uVar2);
  pvVar1 = ctx->cfg;
  uVar2 = mpp_frame_get_ver_stride(frm);
  mpp_enc_cfg_set_s32(pvVar1,"prep:ver_stride",uVar2);
  pvVar1 = ctx->cfg;
  uVar2 = mpp_frame_get_fmt(frm);
  mpp_enc_cfg_set_s32(pvVar1,"prep:format",uVar2);
  MVar3 = (*ctx->enc_mpi->control)(ctx->enc_ctx,MPP_ENC_SET_CFG,ctx->cfg);
  (*ctx->dec_mpi_post->control)(ctx->dec_ctx_post,MPP_DEC_SET_FRAME_INFO,frm);
  return MVar3;
}

Assistant:

static MPP_RET mpi_rc_info_change(MpiRc2TestCtx *ctx, MppFrame frm)
{
    MPP_RET ret = MPP_OK;

    mpp_enc_cfg_set_s32(ctx->cfg, "prep:width", mpp_frame_get_width(frm));
    mpp_enc_cfg_set_s32(ctx->cfg, "prep:height", mpp_frame_get_height(frm));
    mpp_enc_cfg_set_s32(ctx->cfg, "prep:hor_stride",  mpp_frame_get_hor_stride(frm));
    mpp_enc_cfg_set_s32(ctx->cfg, "prep:ver_stride", mpp_frame_get_ver_stride(frm));
    mpp_enc_cfg_set_s32(ctx->cfg, "prep:format", mpp_frame_get_fmt(frm));

    ret = ctx->enc_mpi->control(ctx->enc_ctx, MPP_ENC_SET_CFG, ctx->cfg);

    ctx->dec_mpi_post->control(ctx->dec_ctx_post, MPP_DEC_SET_FRAME_INFO, (MppParam)frm);

    return ret;
}